

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O2

UVec3 __thiscall
vkt::image::anon_unknown_0::getLocalWorkGroupSize
          (anon_unknown_0 *this,ImageType imageType,UVec3 *imageSize)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  UVec3 UVar4;
  UVec3 computeGridSize;
  
  UVar4 = getShaderGridSize((image *)&computeGridSize,imageType,imageSize);
  uVar1 = 2;
  if (computeGridSize.m_data[2] < 2) {
    uVar1 = computeGridSize.m_data[2];
  }
  uVar2 = -(uint)(-0x7ffffff9 < (int)(computeGridSize.m_data[0] ^ 0x80000000));
  uVar3 = -(uint)(-0x7ffffff9 < (int)(computeGridSize.m_data[1] ^ 0x80000000));
  *(uint *)this = uVar2 & 8 | ~uVar2 & computeGridSize.m_data[0];
  *(uint *)(this + 4) = uVar3 & 8 | ~uVar3 & computeGridSize.m_data[1];
  *(uint *)(this + 8) = uVar1;
  UVar4.m_data._0_8_ = this;
  return (UVec3)UVar4.m_data;
}

Assistant:

const tcu::UVec3 getLocalWorkGroupSize (const ImageType imageType, const tcu::UVec3& imageSize)
{
	const tcu::UVec3 computeGridSize	= getShaderGridSize(imageType, imageSize);

	const tcu::UVec3 localWorkGroupSize = tcu::UVec3(de::min(g_localWorkGroupSizeBase.x(), computeGridSize.x()),
													 de::min(g_localWorkGroupSizeBase.y(), computeGridSize.y()),
													 de::min(g_localWorkGroupSizeBase.z(), computeGridSize.z()));
	return localWorkGroupSize;
}